

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void __thiscall
MeCab::anon_unknown_0::LatticeImpl::set_boundary_constraint
          (LatticeImpl *this,size_t pos,int boundary_constraint_type)

{
  bool bVar1;
  reference pvVar2;
  value_type in_DL;
  value_type_conflict4 *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__new_size;
  
  __new_size = in_RDI;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(in_RDI);
  if (bVar1) {
    (**(code **)((in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start + 0x58))();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (unaff_retaddr,(size_type)__new_size,in_RSI);
  }
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &in_RDI[6].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(size_type)in_RSI);
  *pvVar2 = in_DL;
  return;
}

Assistant:

void LatticeImpl::set_boundary_constraint(size_t pos,
                                          int boundary_constraint_type) {
  if (boundary_constraint_.empty()) {
    boundary_constraint_.resize(size() + 4, MECAB_ANY_BOUNDARY);
  }
  boundary_constraint_[pos] = boundary_constraint_type;
}